

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::OptionNotFound::~OptionNotFound(OptionNotFound *this)

{
  OptionNotFound *this_local;
  
  ~OptionNotFound(this);
  operator_delete(this);
  return;
}

Assistant:

OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}